

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int __thiscall json::Json::init(Json *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  Production *pPVar2;
  JsonError *pJVar3;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d2;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_ad;
  allocator<char> local_99;
  string local_98;
  Array local_78;
  Object local_58;
  Node *local_20;
  Node *OorA;
  Node *J_local;
  Json *this_local;
  
  OorA = (Node *)ctx;
  J_local = (Node *)this;
  bVar1 = parser::Node::isProduction((Node *)ctx);
  if (!bVar1) {
    pJVar3 = (JsonError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"invalid format",&local_f9);
    JsonError::JsonError(pJVar3,&local_f8);
    __cxa_throw(pJVar3,&JsonError::typeinfo,JsonError::~JsonError);
  }
  pPVar2 = parser::Node::getProduction(OorA);
  if (pPVar2->nonTerminal == 1) {
    pPVar2 = parser::Node::getProduction(OorA);
    local_20 = std::vector<parser::Node,_std::allocator<parser::Node>_>::front(&pPVar2->nodes);
    pPVar2 = parser::Node::getProduction(local_20);
    if (pPVar2->nonTerminal == 2) {
      createObject(&local_58,local_20);
      Object::operator=(&this->object,&local_58);
      Object::~Object(&local_58);
      this->type = IsObject;
    }
    else {
      pPVar2 = parser::Node::getProduction(local_20);
      if (pPVar2->nonTerminal != 3) {
        local_ad = 1;
        pJVar3 = (JsonError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_98,"invalid format",&local_99);
        JsonError::JsonError(pJVar3,&local_98);
        local_ad = 0;
        __cxa_throw(pJVar3,&JsonError::typeinfo,JsonError::~JsonError);
      }
      createArray(&local_78,local_20);
      Array::operator=(&this->array,&local_78);
      Array::~Array(&local_78);
      this->type = IsArray;
    }
    return (int)this;
  }
  local_d2 = 1;
  pJVar3 = (JsonError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"invalid format",&local_d1)
  ;
  JsonError::JsonError(pJVar3,&local_d0);
  local_d2 = 0;
  __cxa_throw(pJVar3,&JsonError::typeinfo,JsonError::~JsonError);
}

Assistant:

void init(parser::Node const& J) {
            if (J.isProduction())
                if (rules::Json == J.getProduction().nonTerminal) {
                    parser::Node const& OorA = J.getProduction().nodes.front();
                    if (rules::Object == OorA.getProduction().nonTerminal) {
                        object = createObject(OorA);
                        type = IsObject;
                    } else if (rules::Array == OorA.getProduction().nonTerminal) {
                        array = createArray(OorA);
                        type = IsArray;
                    } else {
                        throw JsonError("invalid format");
                    }
                } else {
                    throw JsonError("invalid format");
                }
            else
                throw JsonError("invalid format");
        }